

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_float64_primitive_compare
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  sysbvm_object_tuple_t *floatObject;
  sysbvm_tuple_t sVar2;
  double dVar3;
  double dVar4;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  uVar1 = *arguments;
  dVar3 = 0.0;
  dVar4 = 0.0;
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    dVar4 = *(double *)(uVar1 + 0x10);
  }
  uVar1 = arguments[1];
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    dVar3 = *(double *)(uVar1 + 0x10);
  }
  sVar2 = 0xfffffffffffffff1;
  if (dVar3 <= dVar4) {
    sVar2 = (ulong)(dVar3 < dVar4) * 0x10 + 1;
  }
  return sVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_float64_primitive_compare(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_float64_t left = sysbvm_tuple_float64_decode(arguments[0]);
    sysbvm_float64_t right = sysbvm_tuple_float64_decode(arguments[1]);
    if(left < right)
        return sysbvm_tuple_integer_encodeSmall(-1);
    else if(left > right)
        return sysbvm_tuple_integer_encodeSmall(1);
    else
        return sysbvm_tuple_integer_encodeSmall(0);
}